

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O3

ptr<snapshot_sync_req> __thiscall
nuraft::snapshot_sync_req::deserialize(snapshot_sync_req *this,buffer_serializer *bs)

{
  ulong uVar1;
  uint8_t uVar2;
  buffer *__tmp_1;
  uint64_t uVar3;
  void *__src;
  size_t sVar4;
  byte *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ptr<snapshot_sync_req> pVar7;
  ptr<buffer> b;
  ptr<snapshot> snp;
  ptr<buffer> local_68;
  buffer *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  uint64_t local_48;
  ptr<snapshot> local_40;
  
  snapshot::deserialize((snapshot *)&local_40,bs);
  uVar3 = buffer_serializer::get_u64(bs);
  uVar2 = buffer_serializer::get_u8(bs);
  local_48 = uVar3;
  __src = buffer_serializer::data(bs);
  local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = bs->pos_;
  sVar4 = buffer_serializer::size(bs);
  if (uVar1 < sVar4) {
    sVar4 = buffer_serializer::size(bs);
    sVar4 = sVar4 - bs->pos_;
    buffer::alloc((buffer *)&local_58,sVar4);
    local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50;
    __dest = buffer::data(local_58);
    memcpy(__dest,__src,sVar4);
  }
  else {
    buffer::alloc((buffer *)&local_58,0);
    local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50;
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001620b0;
  snapshot_sync_req((snapshot_sync_req *)(p_Var5 + 1),&local_40,local_48,&local_68,uVar2 == '\x01');
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  _Var6._M_pi = extraout_RDX;
  if (local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (local_40.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  pVar7.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var6._M_pi;
  pVar7.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot_sync_req>)
         pVar7.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer_serializer& bs) {
    ptr<snapshot> snp(snapshot::deserialize(bs));
    ulong offset = bs.get_u64();
    bool done = bs.get_u8() == 1;
    byte* src = (byte*)bs.data();
    ptr<buffer> b;
    if (bs.pos() < bs.size()) {
        size_t sz = bs.size() - bs.pos();
        b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
    }
    else {
        b = buffer::alloc(0);
    }

    return cs_new<snapshot_sync_req>(snp, offset, b, done);
}